

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O0

void initialize_font_from_file(Display *dpy,int param_2,char *font_name,XFontStruct **font_info)

{
  char *pcVar1;
  undefined1 local_34 [4];
  undefined8 *puStack_30;
  int actual_count;
  char **result;
  XFontStruct **font_info_local;
  char *font_name_local;
  Display *pDStack_10;
  int param_1_local;
  Display *dpy_local;
  
  result = (char **)font_info;
  font_info_local = (XFontStruct **)font_name;
  font_name_local._4_4_ = param_2;
  pDStack_10 = dpy;
  pcVar1 = (char *)XLoadQueryFont(dpy,font_name);
  *result = pcVar1;
  if (pcVar1 == (char *)0x0) {
    fprintf(_stderr,"initialize_font_from_file: Could not open font\n");
    fprintf(_stderr,"  \"%s\".  Resorting to default font.\n",font_info_local);
    puStack_30 = (undefined8 *)
                 XListFonts(pDStack_10,"*-*-fixed-medium-r-*--*-120-*-*-*-*-iso8859-1",1,local_34);
    font_info_local = (XFontStruct **)*puStack_30;
    pcVar1 = (char *)XLoadQueryFont(pDStack_10,font_info_local);
    *result = pcVar1;
    if (pcVar1 == (char *)0x0) {
      fprintf(_stderr,"initialize_font_from_file: Could not open default\n");
      fprintf(_stderr,"  font \"%s\" either.  Exiting...\n",font_info_local);
    }
    XFreeFontNames(puStack_30);
  }
  return;
}

Assistant:

void
initialize_font_from_file(Display *dpy, int /*screen_number*/,
                          const char *font_name, XFontStruct **font_info)
{
  // If the font is valid, you just have to call XLoadQueryFont on it.
  // If it is bogus, you have to do a lot of work to revert to a default font.

  if ((*font_info = XLoadQueryFont(dpy, font_name)) == nullptr) {
    fprintf(stderr, "initialize_font_from_file: Could not open font\n");
    fprintf(stderr, "  \"%s\".  Resorting to default font.\n", font_name);

    // This implementation of reverting to a default font requires that
    // you already know the name of a font that you want to revert to.
    // (Am_DEFAULT_FONT_NAME is defined in gemX.h)
    char **result;
    int actual_count;
    result = XListFonts(dpy, Am_DEFAULT_FONT_NAME, 1, &actual_count);
    font_name = result[0];
    if ((*font_info = XLoadQueryFont(dpy, font_name)) == nullptr) {
      fprintf(stderr, "initialize_font_from_file: Could not open default\n");
      fprintf(stderr, "  font \"%s\" either.  Exiting...\n", font_name);
    }
    XFreeFontNames(result);

    /*      
    // This is the recommended way to get properties of the default font.
    // However, XQueryFont, in it's infinite wisdom, sets the fid slot of the
    // XFontStruct to have the fid of the GC, rather than the default font.
    // This will thwart our later attempt to set the font with XSetFont,
    // since the fid would be wrong, unless we can find out the fid that we
    // want and install it, undoing X's helpful confusion of the GC fid.
    GC default_gc = DefaultGC(dpy, screen_number);
    *font_info = XQueryFont(dpy, XGContextFromGC(default_gc));

    // By asking the default GC about its font, we can identify the
    // default font and install it ourselves in the XFontStruct.
    XGCValues values;
    if (XGetGCValues (dpy, default_gc, GCFont, &values) == 0)
      Am_Error ("** initialize_font_from_file: could not get GC values.\n");
    // Note: Calling XQueryFont on this font (and attempting to do all of this
    // in one step instead of two) does not work -- XQueryFont will return nullptr
    // for the properties of the default font unless you ask for them in the
    // recommended way above.  Thanks, X!
    (*font_info)->fid = values.font;
    */
  }
}